

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O3

void __thiscall Interpreter::print(Interpreter *this)

{
  uint uVar1;
  bool bVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  ulong uVar4;
  undefined8 uStack_28;
  
  uVar1 = this->stackPos;
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"^^^^^^stack^^^^^^\n",0x12);
  if (0 < (long)(int)uVar1) {
    uVar4 = (long)(int)uVar1;
    do {
      poVar3 = std::ostream::_M_insert<double>((double)*(float *)(uVar4 + (long)this->stack));
      uStack_28 = CONCAT17(10,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 7),1);
      bVar2 = 4 < uVar4;
      uVar4 = uVar4 - 4;
    } while (bVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"^^^^^^^^^^^^^^^^^\n",0x12);
  return;
}

Assistant:

void Interpreter::print() {
/*    std::cout << "=====vars=====\n";
    std::map<unsigned int, void *>::iterator it = vars.begin();
    while (it != vars.end()) {
        float f;
        memcpy(&f, it->second, 4);
        std::cout << it->first << " -> " << f << '\n';
        it = std::next(it);
    }

    std::cout << "==============\n";*/

    int pos = stackPos;
    std::cout << "^^^^^^stack^^^^^^\n";
    while (pos > 0) {
        std::cout << *(float *) stackAt(pos) << '\n';
        pos -= 4;
    }
    std::cout << "^^^^^^^^^^^^^^^^^\n";
}